

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O1

void __thiscall
luna::Function::AddLocalVar(Function *this,String *name,int register_id,int begin_pc,int end_pc)

{
  pointer *ppLVar1;
  iterator __position;
  LocalVarInfo local_18;
  
  __position._M_current =
       (this->local_vars_).
       super__Vector_base<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->local_vars_).
      super__Vector_base<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18.name_ = name;
    local_18.register_id_ = register_id;
    local_18.begin_pc_ = begin_pc;
    local_18.end_pc_ = end_pc;
    std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>::
    _M_realloc_insert<luna::Function::LocalVarInfo>(&this->local_vars_,__position,&local_18);
  }
  else {
    *(ulong *)&(__position._M_current)->end_pc_ = CONCAT44(local_18._20_4_,end_pc);
    (__position._M_current)->name_ = name;
    (__position._M_current)->register_id_ = register_id;
    (__position._M_current)->begin_pc_ = begin_pc;
    ppLVar1 = &(this->local_vars_).
               super__Vector_base<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppLVar1 = *ppLVar1 + 1;
  }
  return;
}

Assistant:

void Function::AddLocalVar(String *name, int register_id,
                               int begin_pc, int end_pc)
    {
        local_vars_.push_back(LocalVarInfo(name, register_id, begin_pc, end_pc));
    }